

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O0

void ponger_read_cb(uv_stream_t *stream,ssize_t nread,uv_buf_t *buf)

{
  int iVar1;
  void *pvVar2;
  undefined1 auVar3 [16];
  int64_t eval_b_2;
  int64_t eval_a_2;
  void *eval_b_1;
  void *eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  int i;
  uv_write_t *req;
  uv_buf_t writebuf;
  uv_buf_t *buf_local;
  ssize_t nread_local;
  uv_stream_t *stream_local;
  
  writebuf.len = (size_t)buf;
  if (nread < 0) {
    if (nread != -0xfff) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-ping-pong.c"
              ,0xa9,"nread","==","UV_EOF",nread,"==",0xfffffffffffff001);
      abort();
    }
    puts("got EOF");
    free(*(void **)writebuf.len);
    uv_close(stream,ponger_on_close);
  }
  else {
    for (eval_a._4_4_ = 0; eval_a._4_4_ < nread; eval_a._4_4_ = eval_a._4_4_ + 1) {
      if (buf->base[eval_a._4_4_] == 'I') {
        buf->base[eval_a._4_4_] = 'O';
      }
    }
    auVar3 = uv_buf_init(buf->base,nread & 0xffffffff);
    writebuf.base = auVar3._8_8_;
    req = auVar3._0_8_;
    pvVar2 = malloc(0xc0);
    if (pvVar2 == (void *)0x0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-ping-pong.c"
              ,0xbb,"req","!=","NULL",0,"!=",0);
      abort();
    }
    iVar1 = uv_write(pvVar2,stream,&req,1,pinger_after_write);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-ping-pong.c"
              ,0xbc,"0","==","uv_write(req, stream, &writebuf, 1, pinger_after_write)",0,"==",
              (long)iVar1);
      abort();
    }
  }
  return;
}

Assistant:

static void ponger_read_cb(uv_stream_t* stream,
                           ssize_t nread,
                           const uv_buf_t* buf) {
  uv_buf_t writebuf;
  uv_write_t* req;
  int i;

  if (nread < 0) {
    ASSERT_EQ(nread, UV_EOF);

    puts("got EOF");
    free(buf->base);

    uv_close((uv_handle_t*) stream, ponger_on_close);

    return;
  }

  /* Echo back */
  for (i = 0; i < nread; i++) {
    if (buf->base[i] == 'I')
      buf->base[i] = 'O';
  }

  writebuf = uv_buf_init(buf->base, nread);
  req = malloc(sizeof(*req));
  ASSERT_NOT_NULL(req);
  ASSERT_EQ(0, uv_write(req, stream, &writebuf, 1, pinger_after_write));
}